

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetWords(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,string *content)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  string currentWord;
  string delimiters;
  string standalone;
  value_type local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{}:;()[],<>","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\t\n ","");
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90);
  if (content->_M_string_length != 0) {
    pcVar5 = (content->_M_dataplus)._M_p;
    pcVar4 = pcVar5 + content->_M_string_length;
    do {
      cVar2 = *pcVar5;
      bVar6 = local_48 != 0;
      if ((bVar6) && ((char)*local_50 != cVar2)) {
        lVar3 = 1;
        do {
          bVar6 = local_48 != lVar3;
          if (local_48 == lVar3) break;
          pcVar1 = (char *)((long)local_50 + lVar3);
          lVar3 = lVar3 + 1;
        } while (*pcVar1 != cVar2);
      }
      if (bVar6) {
        if ((char *)local_90._M_string_length != (char *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_90);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_90,0,(char *)local_90._M_string_length,0x10d1da);
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_90,0,local_90._M_string_length,'\x01');
        if ((char *)local_90._M_string_length != (char *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_90);
LAB_00106d41:
          std::__cxx11::string::_M_replace
                    ((ulong)&local_90,0,(char *)local_90._M_string_length,0x10d1da);
        }
      }
      else {
        bVar6 = local_68 != 0;
        if ((bVar6) && ((char)*local_70 != cVar2)) {
          lVar3 = 1;
          do {
            bVar6 = local_68 != lVar3;
            if (local_68 == lVar3) break;
            pcVar1 = (char *)((long)local_70 + lVar3);
            lVar3 = lVar3 + 1;
          } while (*pcVar1 != cVar2);
        }
        if (bVar6) {
          if ((char *)local_90._M_string_length != (char *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_90);
            goto LAB_00106d41;
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_90);
        }
      }
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar4);
  }
  if ((char *)local_90._M_string_length != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_90);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x10d1da);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetWords(const std::string &content) {
    std::string standalone = "{}:;()[],<>";
    auto IsStandalone = [&](char c) {
        for (char itr : standalone) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };


    std::string delimiters = "\t\n ";
    auto IsDelimiter = [&](char c) {
        for (char itr : delimiters) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };

    std::vector<std::string> words;
    std::string currentWord = "";
    auto Add = [&]() {
        if (currentWord.size() == 0) {
            return;
        }
        words.push_back(currentWord);
        currentWord = "";
    };


    for (char itr : content) {
        if (IsStandalone(itr)) {
            Add();
            currentWord = itr;
            Add();
        } else if (IsDelimiter(itr)) {
            Add();
        } else {
            currentWord += itr;
        }
    }

    Add();

    return words;
}